

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipart_upload.c
# Opt level: O0

Qiniu_Error
readMedium(Qiniu_Record_Medium *medium,char **uploadId,Qiniu_Uint64 *expireAt,
          Qiniu_UploadPartResp *ret)

{
  cJSON *self;
  Qiniu_Int64 QVar1;
  char *pcVar2;
  Qiniu_Error QVar3;
  undefined8 extraout_RDX;
  cJSON *blockInfo;
  undefined4 uStack_1054;
  char local_1048 [8];
  char buf [4096];
  ulong local_40;
  size_t haveRead;
  Qiniu_UploadPartResp *ret_local;
  Qiniu_Uint64 *expireAt_local;
  char **uploadId_local;
  Qiniu_Record_Medium *medium_local;
  Qiniu_Error err;
  
  medium_local = (Qiniu_Record_Medium *)Qiniu_OK._0_8_;
  err._0_8_ = Qiniu_OK.message;
  haveRead = (size_t)ret;
  ret_local = (Qiniu_UploadPartResp *)expireAt;
  expireAt_local = (Qiniu_Uint64 *)uploadId;
  uploadId_local = (char **)medium;
  QVar3.code = (*medium->readEntry)(medium,local_1048,0x1000,&local_40);
  medium_local = (Qiniu_Record_Medium *)CONCAT44(uStack_1054,QVar3.code);
  err._0_8_ = extraout_RDX;
  if (QVar3.code == (Qiniu_Error)0xc8) {
    if (local_40 < 0x1000) {
      self = cJSON_Parse(local_1048);
      QVar1 = Qiniu_Json_GetInt64(self,"partNum",-1);
      *(int *)(haveRead + 0x10) = (int)QVar1;
      pcVar2 = Qiniu_Json_GetString(self,"md5",(char *)0x0);
      pcVar2 = Qiniu_String_Dup(pcVar2);
      *(char **)haveRead = pcVar2;
      pcVar2 = Qiniu_Json_GetString(self,"etag",(char *)0x0);
      pcVar2 = Qiniu_String_Dup(pcVar2);
      *(char **)(haveRead + 8) = pcVar2;
      if (expireAt_local != (Qiniu_Uint64 *)0x0) {
        pcVar2 = Qiniu_Json_GetString(self,"uploadId",(char *)0x0);
        pcVar2 = Qiniu_String_Dup(pcVar2);
        *expireAt_local = (Qiniu_Uint64)pcVar2;
      }
      if (ret_local != (Qiniu_UploadPartResp *)0x0) {
        pcVar2 = (char *)Qiniu_Json_GetUInt64(self,"expireAt",0);
        ret_local->md5 = pcVar2;
      }
      cJSON_Delete(self);
    }
    else {
      (*(code *)uploadId_local[3])(uploadId_local);
      medium_local = (Qiniu_Record_Medium *)0x1f4;
      err._0_8_ = anon_var_dwarf_a434;
    }
  }
  else {
    (*(code *)uploadId_local[3])(uploadId_local);
  }
  QVar3._0_8_ = (ulong)medium_local & 0xffffffff;
  QVar3.message = (char *)err._0_8_;
  return QVar3;
}

Assistant:

Qiniu_Error readMedium(struct Qiniu_Record_Medium *medium, char **uploadId, Qiniu_Uint64 *expireAt, Qiniu_UploadPartResp *ret)
{
    Qiniu_Error err = Qiniu_OK;
#define BUFFER_SIZE (1 << 12)
    size_t haveRead;
    char buf[BUFFER_SIZE];
    err = medium->readEntry(medium, buf, BUFFER_SIZE, &haveRead);
    if (err.code != 200)
    {
        medium->close(medium);
        return err;
    }
    if (haveRead >= BUFFER_SIZE)
    {
        medium->close(medium);
        err.code = 500;
        err.message = "recorder entry is too large";
        return err;
    }
    cJSON *blockInfo = cJSON_Parse(buf);
    ret->partNum = (int)Qiniu_Json_GetInt64(blockInfo, "partNum", -1);
    ret->md5 = Qiniu_String_Dup(Qiniu_Json_GetString(blockInfo, "md5", NULL));
    ret->etag = Qiniu_String_Dup(Qiniu_Json_GetString(blockInfo, "etag", NULL));
    if (uploadId != NULL)
    {
        *uploadId = Qiniu_String_Dup(Qiniu_Json_GetString(blockInfo, "uploadId", NULL));
    }
    if (expireAt != NULL)
    {
        *expireAt = Qiniu_Json_GetUInt64(blockInfo, "expireAt", 0);
    }
    cJSON_Delete(blockInfo);
    return err;
#undef BUFFER_SIZE
}